

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::clara::TextFlow::Column::iterator::isBoundary(iterator *this,size_t at)

{
  bool bVar1;
  string *psVar2;
  size_type sVar3;
  const_reference pvVar4;
  bool local_29;
  size_t at_local;
  iterator *this_local;
  
  if (at == 0) {
    __assert_fail("at > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pyxll[P]xlfparser/tests/catch.hpp"
                  ,0x1909,"bool Catch::clara::TextFlow::Column::iterator::isBoundary(size_t) const")
    ;
  }
  psVar2 = line_abi_cxx11_(this);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (psVar2);
  if (at <= sVar3) {
    psVar2 = line_abi_cxx11_(this);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (psVar2);
    local_29 = true;
    if (at != sVar3) {
      psVar2 = line_abi_cxx11_(this);
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](psVar2,at);
      bVar1 = isWhitespace(*pvVar4);
      if (bVar1) {
        psVar2 = line_abi_cxx11_(this);
        pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](psVar2,at - 1);
        bVar1 = isWhitespace(*pvVar4);
        if (!bVar1) {
          return true;
        }
      }
      psVar2 = line_abi_cxx11_(this);
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](psVar2,at);
      bVar1 = isBreakableBefore(*pvVar4);
      local_29 = true;
      if (!bVar1) {
        psVar2 = line_abi_cxx11_(this);
        pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](psVar2,at - 1);
        local_29 = isBreakableAfter(*pvVar4);
      }
    }
    return local_29;
  }
  __assert_fail("at <= line().size()",
                "/workspace/llm4binary/github/license_c_cmakelists/pyxll[P]xlfparser/tests/catch.hpp"
                ,0x190a,"bool Catch::clara::TextFlow::Column::iterator::isBoundary(size_t) const");
}

Assistant:

auto isBoundary(size_t at) const -> bool {
			assert(at > 0);
			assert(at <= line().size());

			return at == line().size() ||
				(isWhitespace(line()[at]) && !isWhitespace(line()[at - 1])) ||
				isBreakableBefore(line()[at]) ||
				isBreakableAfter(line()[at - 1]);
		}